

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitAlphaRGBA4444(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  long *in_RSI;
  VP8Io *in_RDI;
  uint32_t alpha_value;
  int j;
  int i;
  uint32_t alpha_mask;
  uint8_t *alpha_dst;
  uint8_t *base_rgba;
  size_t start_y;
  int num_rows;
  WebPRGBABuffer *buf;
  WEBP_CSP_MODE colorspace;
  int mb_w;
  uint8_t *alpha;
  int local_5c;
  int local_58;
  uint local_54;
  uint8_t *local_50;
  int local_34;
  long *local_30;
  WEBP_CSP_MODE local_28;
  int local_24;
  uint8_t *local_20 [3];
  VP8Io *local_8;
  
  local_20[0] = in_RDI->a;
  if (local_20[0] != (uint8_t *)0x0) {
    local_24 = in_RDI->mb_w;
    local_28 = *(WEBP_CSP_MODE *)*in_RSI;
    local_30 = (long *)(*in_RSI + 0x10);
    local_8 = in_RDI;
    iVar2 = GetAlphaSourceRow(in_RDI,local_20,&local_34);
    puVar3 = (uint8_t *)(*local_30 + (long)iVar2 * (long)(int)local_30[1]);
    local_50 = puVar3 + 1;
    local_54 = 0xf;
    for (local_5c = 0; local_5c < local_34; local_5c = local_5c + 1) {
      for (local_58 = 0; local_58 < local_24; local_58 = local_58 + 1) {
        bVar1 = local_20[0][local_58];
        local_50[local_58 << 1] = local_50[local_58 << 1] & 0xf0 | (byte)((int)(uint)bVar1 >> 4);
        local_54 = (int)(uint)bVar1 >> 4 & local_54;
      }
      local_20[0] = local_20[0] + local_8->width;
      local_50 = local_50 + (int)local_30[1];
    }
    if ((local_54 != 0xf) && (iVar2 = WebPIsPremultipliedMode(local_28), iVar2 != 0)) {
      (*WebPApplyAlphaMultiply4444)(puVar3,local_24,local_34,(int)local_30[1]);
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaRGBA4444(const VP8Io* const io, WebPDecParams* const p,
                             int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  if (alpha != NULL) {
    const int mb_w = io->mb_w;
    const WEBP_CSP_MODE colorspace = p->output->colorspace;
    const WebPRGBABuffer* const buf = &p->output->u.RGBA;
    int num_rows;
    const size_t start_y = GetAlphaSourceRow(io, &alpha, &num_rows);
    uint8_t* const base_rgba = buf->rgba + start_y * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
    uint8_t* alpha_dst = base_rgba;
#else
    uint8_t* alpha_dst = base_rgba + 1;
#endif
    uint32_t alpha_mask = 0x0f;
    int i, j;
    for (j = 0; j < num_rows; ++j) {
      for (i = 0; i < mb_w; ++i) {
        // Fill in the alpha value (converted to 4 bits).
        const uint32_t alpha_value = alpha[i] >> 4;
        alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
        alpha_mask &= alpha_value;
      }
      alpha += io->width;
      alpha_dst += buf->stride;
    }
    (void)expected_num_lines_out;
    assert(expected_num_lines_out == num_rows);
    if (alpha_mask != 0x0f && WebPIsPremultipliedMode(colorspace)) {
      WebPApplyAlphaMultiply4444(base_rgba, mb_w, num_rows, buf->stride);
    }
  }
  return 0;
}